

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeTiledLevel
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
              int pixel_data_size,uchar *head,size_t size,string *err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int width;
  int iVar4;
  int num_lines;
  pointer pvVar5;
  long *plVar6;
  long lVar7;
  int *requested_pixel_types;
  EXRChannelInfo *channel_offset_list_00;
  bool bVar8;
  int iVar9;
  int y;
  EXRTile *pEVar10;
  uchar **out_images;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int tile_idx;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int line_order;
  uint uVar17;
  int iVar18;
  long lVar19;
  EXRAttribute *in_stack_ffffffffffffff48;
  undefined7 uStack_b0;
  bool alloc_success;
  
  iVar15 = exr_header->tile_level_mode;
  if (iVar15 == 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = exr_image->level_x;
    if (iVar15 == 2) {
      iVar9 = iVar9 + exr_image->level_y * offset_data->num_x_levels;
    }
    else if (iVar15 != 1) {
      iVar9 = -1;
    }
  }
  pvVar5 = (offset_data->offsets).
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar6 = *(long **)&pvVar5[iVar9].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl;
  iVar15 = (int)((ulong)((long)*(pointer *)
                                ((long)&pvVar5[iVar9].
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl + 8) - (long)plVar6) >> 3) * -0x55555555;
  iVar18 = -4;
  if (0 < iVar15) {
    uVar13 = (ulong)(plVar6[1] - *plVar6) >> 3;
    iVar12 = (int)uVar13;
    if (0 < iVar12) {
      iVar18 = exr_header->num_channels;
      uVar16 = iVar15 * iVar12;
      pEVar10 = (EXRTile *)calloc((ulong)uVar16,0x20);
      exr_image->tiles = pEVar10;
      lVar19 = 0;
      uVar14 = 0;
      uVar17 = 0;
      do {
        alloc_success = false;
        out_images = AllocateImage(iVar18,exr_header->channels,exr_header->requested_pixel_types,
                                   exr_header->tile_size_x,exr_header->tile_size_y,&alloc_success);
        pEVar10 = exr_image->tiles;
        *(uchar ***)((long)&pEVar10->images + lVar19) = out_images;
        if (alloc_success == false) {
LAB_001101ff:
          uVar17 = uVar17 | 1;
        }
        else {
          uVar11 = uVar13 & 0xffffffff;
          lVar7 = *(long *)(*(long *)(*(long *)&(offset_data->offsets).
                                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[iVar9].
                                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                ._M_impl + ((uVar14 & 0xffffffff) / uVar11) * 0x18)
                           + ((uVar14 & 0xffffffff) % uVar11) * 8);
          if (size < lVar7 + 0x14U) {
LAB_00110153:
            uVar17 = uVar17 | 2;
          }
          else {
            iVar15 = *(int *)(head + lVar7 + 8);
            if ((iVar15 != exr_image->level_x) ||
               (iVar12 = *(int *)(head + lVar7 + 0xc), iVar12 != exr_image->level_y))
            goto LAB_001101ff;
            uVar11 = (ulong)*(int *)(head + lVar7 + 0x10);
            if (((long)uVar11 < 2) || (size - (lVar7 + 0x14U) < uVar11)) goto LAB_00110153;
            iVar1 = *(int *)(head + lVar7);
            iVar2 = *(int *)(head + lVar7 + 4);
            iVar3 = exr_image->width;
            width = exr_header->tile_size_x;
            if (iVar3 < width * iVar1) {
LAB_001101f6:
              uVar17 = uVar17 | 4;
            }
            else {
              iVar4 = exr_image->height;
              y = exr_header->tile_size_y;
              if (iVar4 < y * iVar2) goto LAB_001101f6;
              line_order = width;
              if (iVar3 <= (iVar1 + 1) * width) {
                line_order = iVar3 - width * iVar1;
              }
              requested_pixel_types = exr_header->requested_pixel_types;
              iVar3 = exr_header->compression_type;
              num_lines = exr_header->num_channels;
              channel_offset_list_00 = exr_header->channels;
              *(int *)((long)&pEVar10->width + lVar19) = line_order;
              if (iVar4 <= (iVar2 + 1) * y) {
                y = iVar4 - y * iVar2;
              }
              *(int *)((long)&pEVar10->height + lVar19) = y;
              bVar8 = DecodePixelData(out_images,requested_pixel_types,head + lVar7 + 0x14,uVar11,
                                      iVar3,line_order,width,0,0,y,pixel_data_size,num_lines,
                                      (size_t)channel_offset_list_00,(size_t)channel_offset_list,
                                      in_stack_ffffffffffffff48,CONCAT17(alloc_success,uStack_b0),
                                      (EXRChannelInfo *)CONCAT44(iVar18,iVar15),
                                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      channel_offset_list_00);
              if (!bVar8) {
                uVar17 = uVar17 | 4;
              }
              pEVar10 = exr_image->tiles;
            }
            *(int *)((long)&pEVar10->offset_x + lVar19) = iVar1;
            *(int *)((long)&pEVar10->offset_y + lVar19) = iVar2;
            *(int *)((long)&pEVar10->level_x + lVar19) = iVar15;
            *(int *)((long)&pEVar10->level_y + lVar19) = iVar12;
          }
        }
        uVar14 = uVar14 + 1;
        lVar19 = lVar19 + 0x20;
      } while (uVar16 != uVar14);
      exr_image->num_channels = iVar18;
      exr_image->num_tiles = uVar16;
      iVar18 = (uint)(uVar17 == 0) * 4 + -4;
      if (err != (string *)0x0) {
        if ((uVar17 & 2) != 0) {
          std::__cxx11::string::append((char *)err);
        }
        if ((uVar17 & 4) != 0) {
          std::__cxx11::string::append((char *)err);
        }
      }
    }
  }
  return iVar18;
}

Assistant:

static int DecodeTiledLevel(EXRImage* exr_image, const EXRHeader* exr_header,
  const OffsetData& offset_data,
  const std::vector<size_t>& channel_offset_list,
  int pixel_data_size,
  const unsigned char* head, const size_t size,
  std::string* err) {
  int num_channels = exr_header->num_channels;

  int level_index = LevelIndex(exr_image->level_x, exr_image->level_y, exr_header->tile_level_mode, offset_data.num_x_levels);
  int num_y_tiles = int(offset_data.offsets[size_t(level_index)].size());
  if (num_y_tiles < 1) {
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int num_x_tiles = int(offset_data.offsets[size_t(level_index)][0].size());
  if (num_x_tiles < 1) {
    return TINYEXR_ERROR_INVALID_DATA;
  }
  int num_tiles = num_x_tiles * num_y_tiles;

  int err_code = TINYEXR_SUCCESS;

  enum {
    EF_SUCCESS = 0,
    EF_INVALID_DATA = 1,
    EF_INSUFFICIENT_DATA = 2,
    EF_FAILED_TO_DECODE = 4
  };
#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<unsigned> error_flag(EF_SUCCESS);
#else
  unsigned error_flag(EF_SUCCESS);
#endif

  // Although the spec says : "...the data window is subdivided into an array of smaller rectangles...",
  // the IlmImf library allows the dimensions of the tile to be larger (or equal) than the dimensions of the data window.
#if 0
  if ((exr_header->tile_size_x > exr_image->width || exr_header->tile_size_y > exr_image->height) &&
    exr_image->level_x == 0 && exr_image->level_y == 0) {
    if (err) {
      (*err) += "Failed to decode tile data.\n";
    }
    err_code = TINYEXR_ERROR_INVALID_DATA;
  }
#endif
  exr_image->tiles = static_cast<EXRTile*>(
    calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::vector<std::thread> workers;
  std::atomic<int> tile_count(0);

  int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
#if (TINYEXR_MAX_THREADS > 0)
  num_threads = std::min(num_threads,TINYEXR_MAX_THREADS);
#endif
  if (num_threads > int(num_tiles)) {
    num_threads = int(num_tiles);
  }
  for (int t = 0; t < num_threads; t++) {
    workers.emplace_back(std::thread([&]()
      {
        int tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
  for (int tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
    // Allocate memory for each tile.
    bool alloc_success = false;
    exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
      num_channels, exr_header->channels,
      exr_header->requested_pixel_types, exr_header->tile_size_x,
      exr_header->tile_size_y, &alloc_success);

    if (!alloc_success) {
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int x_tile = tile_idx % num_x_tiles;
    int y_tile = tile_idx / num_x_tiles;
    // 16 byte: tile coordinates
    // 4 byte : data size
    // ~      : data(uncompressed or compressed)
    tinyexr::tinyexr_uint64 offset = offset_data.offsets[size_t(level_index)][size_t(y_tile)][size_t(x_tile)];
    if (offset + sizeof(int) * 5 > size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    size_t data_size =
      size_t(size - (offset + sizeof(int) * 5));
    const unsigned char* data_ptr =
      reinterpret_cast<const unsigned char*>(head + offset);

    int tile_coordinates[4];
    memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
    tinyexr::swap4(&tile_coordinates[0]);
    tinyexr::swap4(&tile_coordinates[1]);
    tinyexr::swap4(&tile_coordinates[2]);
    tinyexr::swap4(&tile_coordinates[3]);

    if (tile_coordinates[2] != exr_image->level_x) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }
    if (tile_coordinates[3] != exr_image->level_y) {
      // Invalid data.
      error_flag |= EF_INVALID_DATA;
      continue;
    }

    int data_len;
    memcpy(&data_len, data_ptr + 16,
      sizeof(int));  // 16 = sizeof(tile_coordinates)
    tinyexr::swap4(&data_len);

    if (data_len < 2 || size_t(data_len) > data_size) {
      // Insufficient data size.
      error_flag |= EF_INSUFFICIENT_DATA;
      continue;
    }

    // Move to data addr: 20 = 16 + 4;
    data_ptr += 20;
    bool ret = tinyexr::DecodeTiledPixelData(
      exr_image->tiles[tile_idx].images,
      &(exr_image->tiles[tile_idx].width),
      &(exr_image->tiles[tile_idx].height),
      exr_header->requested_pixel_types, data_ptr,
      static_cast<size_t>(data_len), exr_header->compression_type,
      exr_image->width, exr_image->height,
      tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
      exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
      static_cast<size_t>(exr_header->num_custom_attributes),
      exr_header->custom_attributes,
      static_cast<size_t>(exr_header->num_channels),
      exr_header->channels, channel_offset_list);

    if (!ret) {
      // Failed to decode tile data.
      error_flag |= EF_FAILED_TO_DECODE;
    }

    exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
    exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
    exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
    exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  }
        }));
    }  // num_thread loop

    for (auto& t : workers) {
      t.join();
    }

#else
  } // parallel for
#endif

  // Even in the event of an error, the reserved memory may be freed.
  exr_image->num_channels = num_channels;
  exr_image->num_tiles = static_cast<int>(num_tiles);

  if (error_flag)  err_code = TINYEXR_ERROR_INVALID_DATA;
  if (err) {
    if (error_flag & EF_INSUFFICIENT_DATA) {
      (*err) += "Insufficient data length.\n";
    }
    if (error_flag & EF_FAILED_TO_DECODE) {
      (*err) += "Failed to decode tile data.\n";
    }
  }
  return err_code;
}